

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_videos_worth_spreading.cpp
# Opt level: O2

void solve_videos_worth_spreading(void)

{
  Cache *cache;
  Video *video;
  pointer ppVar1;
  ostream *poVar2;
  pointer ppVar3;
  long lVar4;
  ulong uVar5;
  int cache_id;
  long lVar6;
  
  for (lVar6 = 0; lVar6 < num_caches; lVar6 = lVar6 + 1) {
    cache = caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
    compute(cache);
    lVar4 = 8;
    ppVar1 = sorted_aggregate_videos.
             super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = sorted_aggregate_videos.
             super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; uVar5 < (ulong)((long)ppVar1 - (long)ppVar3 >> 4); uVar5 = uVar5 + 1) {
      video = *(Video **)((long)&ppVar3->first + lVar4);
      if (((mlc.super__Base_bitset<1563UL>._M_w[(ulong)(long)video->id >> 6] >>
            ((long)video->id & 0x3fU) & 1) != 0) && (video->size <= cache->remaining)) {
        Cache::add_video(cache,video);
        ppVar1 = sorted_aggregate_videos.
                 super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar3 = sorted_aggregate_videos.
                 super__Vector_base<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cerr,
                      (*caches.super__Vector_base<Cache_*,_std::allocator<Cache_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->remaining);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void solve_videos_worth_spreading() {
    for (int cache_id = 0; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        compute(cache);
        for (int i = 0; i < sorted_aggregate_videos.size(); ++i) {
            Video *video = sorted_aggregate_videos[i].second;
            if (exists(cache, video) && cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }

    cerr << caches[0]->remaining << endl;
    cerr << caches[0]->videos.size() << endl;
}